

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void cf_close(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)cf->ctx;
  if (puVar1 != (undefined8 *)0x0) {
    (*Curl_ssl->close)(cf,data);
    *(undefined4 *)(puVar1 + 10) = 0;
    if ((void *)puVar1[1] != (void *)*puVar1) {
      (*Curl_cfree)((void *)puVar1[1]);
    }
    (*Curl_cfree)((void *)puVar1[2]);
    (*Curl_cfree)((void *)*puVar1);
    *(undefined8 *)((long)puVar1 + 0xc) = 0;
    *(undefined8 *)((long)puVar1 + 0x14) = 0;
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  return;
}

Assistant:

static void cf_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  if(connssl) {
    Curl_ssl->close(cf, data);
    connssl->state = ssl_connection_none;
    Curl_ssl_peer_cleanup(&connssl->peer);
  }
  cf->connected = FALSE;
}